

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void computeLimitRegisters(Parse *pParse,Select *p,int iBreak)

{
  long lVar1;
  int iVar2;
  Parse *pParse_00;
  int p2;
  undefined4 in_EDX;
  Expr *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  Expr *pLimit;
  int iOffset;
  int iLimit;
  Vdbe *v;
  int n;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  Vdbe *p_00;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0xaaaaaaaa;
  p_00 = (Vdbe *)in_RSI[1].pRight;
  if (((in_RSI->u).iValue == 0) && (p_00 != (Vdbe *)0x0)) {
    p2 = *(int *)(in_RDI + 0x3c) + 1;
    *(int *)(in_RDI + 0x3c) = p2;
    (in_RSI->u).iValue = p2;
    pParse_00 = (Parse *)sqlite3GetVdbe((Parse *)CONCAT44(in_stack_ffffffffffffffbc,
                                                          in_stack_ffffffffffffffb8));
    iVar2 = sqlite3ExprIsInteger(in_RSI,(int *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),pParse_00)
    ;
    if (iVar2 == 0) {
      sqlite3ExprCode(pParse_00,(Expr *)CONCAT44(p2,uVar3),(int)((ulong)p_00 >> 0x20));
      sqlite3VdbeAddOp1(p_00,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      sqlite3VdbeAddOp2(p_00,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,0);
    }
    else {
      sqlite3VdbeAddOp2(p_00,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,0);
    }
    if (p_00->pParse != (Parse *)0x0) {
      iVar2 = *(int *)(in_RDI + 0x3c) + 1;
      *(int *)(in_RDI + 0x3c) = iVar2;
      *(int *)((long)&in_RSI->u + 4) = iVar2;
      *(int *)(in_RDI + 0x3c) = *(int *)(in_RDI + 0x3c) + 1;
      sqlite3ExprCode(pParse_00,(Expr *)CONCAT44(p2,iVar2),(int)((ulong)p_00 >> 0x20));
      sqlite3VdbeAddOp1(p_00,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),
                        (int)((ulong)pParse_00 >> 0x20),(int)pParse_00,p2,iVar2);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void computeLimitRegisters(Parse *pParse, Select *p, int iBreak){
  Vdbe *v = 0;
  int iLimit = 0;
  int iOffset;
  int n;
  Expr *pLimit = p->pLimit;

  if( p->iLimit ) return;

  /*
  ** "LIMIT -1" always shows all rows.  There is some
  ** controversy about what the correct behavior should be.
  ** The current implementation interprets "LIMIT 0" to mean
  ** no rows.
  */
  if( pLimit ){
    assert( pLimit->op==TK_LIMIT );
    assert( pLimit->pLeft!=0 );
    p->iLimit = iLimit = ++pParse->nMem;
    v = sqlite3GetVdbe(pParse);
    assert( v!=0 );
    if( sqlite3ExprIsInteger(pLimit->pLeft, &n, pParse) ){
      sqlite3VdbeAddOp2(v, OP_Integer, n, iLimit);
      VdbeComment((v, "LIMIT counter"));
      if( n==0 ){
        sqlite3VdbeGoto(v, iBreak);
      }else if( n>=0 && p->nSelectRow>sqlite3LogEst((u64)n) ){
        p->nSelectRow = sqlite3LogEst((u64)n);
        p->selFlags |= SF_FixedLimit;
      }
    }else{
      sqlite3ExprCode(pParse, pLimit->pLeft, iLimit);
      sqlite3VdbeAddOp1(v, OP_MustBeInt, iLimit); VdbeCoverage(v);
      VdbeComment((v, "LIMIT counter"));
      sqlite3VdbeAddOp2(v, OP_IfNot, iLimit, iBreak); VdbeCoverage(v);
    }
    if( pLimit->pRight ){
      p->iOffset = iOffset = ++pParse->nMem;
      pParse->nMem++;   /* Allocate an extra register for limit+offset */
      sqlite3ExprCode(pParse, pLimit->pRight, iOffset);
      sqlite3VdbeAddOp1(v, OP_MustBeInt, iOffset); VdbeCoverage(v);
      VdbeComment((v, "OFFSET counter"));
      sqlite3VdbeAddOp3(v, OP_OffsetLimit, iLimit, iOffset+1, iOffset);
      VdbeComment((v, "LIMIT+OFFSET"));
    }
  }
}